

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::SupportVectorRegressor::_InternalSerialize
          (SupportVectorRegressor *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  double dVar1;
  uint uVar2;
  SparseSupportVectors *this_00;
  DenseSupportVectors *this_01;
  void *data;
  uint32_t uVar3;
  ulong uVar4;
  int size;
  Kernel *this_02;
  Coefficients *this_03;
  size_t __n;
  uint8_t *puVar5;
  
  this_02 = this->kernel_;
  if (this_02 != (Kernel *)0x0 &&
      this != (SupportVectorRegressor *)_SupportVectorRegressor_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      this_02 = this->kernel_;
    }
    *target = '\n';
    uVar2 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar2;
    if (uVar2 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar2,target + 1);
    }
    target = Kernel::_InternalSerialize(this_02,puVar5,stream);
  }
  uVar3 = this->_oneof_case_[0];
  if (uVar3 == 2) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = (this->supportVectors_).sparsesupportvectors_;
    *target = '\x12';
    uVar2 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar2;
    if (uVar2 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar2,target + 1);
    }
    target = SparseSupportVectors::_InternalSerialize(this_00,puVar5,stream);
    uVar3 = this->_oneof_case_[0];
  }
  if (uVar3 == 3) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = (this->supportVectors_).densesupportvectors_;
    *target = '\x1a';
    uVar2 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar2;
    if (uVar2 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar2,target + 1);
    }
    target = DenseSupportVectors::_InternalSerialize(this_01,puVar5,stream);
  }
  this_03 = this->coefficients_;
  if (this_03 != (Coefficients *)0x0 &&
      this != (SupportVectorRegressor *)_SupportVectorRegressor_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      this_03 = this->coefficients_;
    }
    *target = '\"';
    uVar2 = (this_03->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar2;
    if (uVar2 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar2,target + 1);
    }
    target = Coefficients::_InternalSerialize(this_03,puVar5,stream);
  }
  dVar1 = this->rho_;
  if (dVar1 != 0.0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      dVar1 = this->rho_;
    }
    *target = ')';
    *(double *)(target + 1) = dVar1;
    target = target + 9;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    uVar4 = uVar4 & 0xfffffffffffffffc;
    data = *(void **)(uVar4 + 8);
    size = (int)*(undefined8 *)(uVar4 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar5;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* SupportVectorRegressor::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.SupportVectorRegressor)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->_internal_has_kernel()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::kernel(this), target, stream);
  }

  // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 2;
  if (_internal_has_sparsesupportvectors()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::sparsesupportvectors(this), target, stream);
  }

  // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 3;
  if (_internal_has_densesupportvectors()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::densesupportvectors(this), target, stream);
  }

  // .CoreML.Specification.Coefficients coefficients = 4;
  if (this->_internal_has_coefficients()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::coefficients(this), target, stream);
  }

  // double rho = 5;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_rho = this->_internal_rho();
  uint64_t raw_rho;
  memcpy(&raw_rho, &tmp_rho, sizeof(tmp_rho));
  if (raw_rho != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(5, this->_internal_rho(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.SupportVectorRegressor)
  return target;
}